

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupOutputVec(Gia_Man_t *p,Vec_Int_t *vOutPres)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  int iVar12;
  long lVar13;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x10c,"Gia_Man_t *Gia_ManDupOutputVec(Gia_Man_t *, Vec_Int_t *)");
  }
  if (p->vCos->nSize != vOutPres->nSize) {
    __assert_fail("Gia_ManPoNum(p) == Vec_IntSize(vOutPres)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x10d,"Gia_Man_t *Gia_ManDupOutputVec(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  iVar6 = p->nRegs;
  pVVar11 = p->vCis;
  iVar12 = pVVar11->nSize;
  if (iVar6 < iVar12) {
    lVar13 = 0;
    do {
      if (iVar12 <= lVar13) goto LAB_00674bed;
      iVar12 = pVVar11->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_00674bce;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_00674c0c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00674c0c;
      pGVar3[iVar12].Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      iVar6 = p->nRegs;
      pVVar11 = p->vCis;
      iVar12 = pVVar11->nSize;
    } while (lVar13 < iVar12 - iVar6);
  }
  pVVar11 = p->vCos;
  iVar12 = pVVar11->nSize;
  if (iVar6 < iVar12) {
    lVar13 = 0;
    do {
      if (iVar12 <= lVar13) goto LAB_00674bed;
      iVar1 = pVVar11->pArray[lVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00674bce;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vOutPres->nSize <= lVar13) goto LAB_00674bed;
      if (vOutPres->pArray[lVar13] != 0) {
        pGVar3 = p->pObjs + iVar1;
        Gia_ManDupOrderDfs_rec(p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
        iVar6 = p->nRegs;
        pVVar11 = p->vCos;
      }
      lVar13 = lVar13 + 1;
      iVar12 = pVVar11->nSize;
    } while (lVar13 < iVar12 - iVar6);
  }
  if (iVar6 < iVar12) {
    lVar13 = 0;
    do {
      if (iVar12 <= lVar13) {
LAB_00674bed:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar12 = pVVar11->pArray[lVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_00674bce:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      if (vOutPres->nSize <= lVar13) goto LAB_00674bed;
      if (vOutPres->pArray[lVar13] != 0) {
        pGVar3 = p->pObjs + iVar12;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        uVar7 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                     pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                     Value);
        pGVar3->Value = uVar7;
        iVar6 = p->nRegs;
        pVVar11 = p->vCos;
      }
      lVar13 = lVar13 + 1;
      iVar12 = pVVar11->nSize;
    } while (lVar13 < iVar12 - iVar6);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupOutputVec( Gia_Man_t * p, Vec_Int_t * vOutPres )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManPoNum(p) == Vec_IntSize(vOutPres) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vOutPres, i) )
            Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vOutPres, i) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    return pNew;
}